

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O0

void __thiscall
ExtPrivkey_SeedConstructorTest_Privkey_Test::ExtPrivkey_SeedConstructorTest_Privkey_Test
          (ExtPrivkey_SeedConstructorTest_Privkey_Test *this)

{
  ExtPrivkey_SeedConstructorTest_Privkey_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ExtPrivkey_SeedConstructorTest_Privkey_Test_00886740;
  return;
}

Assistant:

TEST(ExtPrivkey, SeedConstructorTest_Privkey) {
  std::string ext_seed = "012345678913579246801472583690FF";
  ExtPrivkey extkey = ExtPrivkey(ByteData(ext_seed), NetType::kMainnet);

  EXPECT_STREQ("0488ade4000000000000000000ef1d96024c1f0b9fd35356984cb6e347e901035f924f8af731fc2924b0ff72130059f40c9ff35a534bf02817c4c9b2a0eff6acc9b2e1e0c822dbbead73e4f69747", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("0488ade4", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, extkey.GetVersion());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_STREQ("xprv9s21ZrQH143K4SS9fUBooJcNan78y4SxCHjma2238tm8pGourqqBZh6pDJHEkksojBRQU4m4kgB1n1dK98tKHKPjxnLyLCUNRK7RgyqDZj7", extkey.ToString().c_str());
  EXPECT_EQ(0, extkey.GetDepth());
  EXPECT_STREQ("59f40c9ff35a534bf02817c4c9b2a0eff6acc9b2e1e0c822dbbead73e4f69747", extkey.GetPrivkey().GetHex().c_str());

  extkey = ExtPrivkey(ByteData(ext_seed), NetType::kTestnet);
  EXPECT_STREQ("04358394000000000000000000ef1d96024c1f0b9fd35356984cb6e347e901035f924f8af731fc2924b0ff72130059f40c9ff35a534bf02817c4c9b2a0eff6acc9b2e1e0c822dbbead73e4f69747", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("04358394", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extprivkey_kVersionTestnetPrivkey, extkey.GetVersion());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_STREQ("tprv8ZgxMBicQKsPfFfgL33JxxEMtuXMCaUxXqetSSSVcsFcbsYzrDAw5SUG8UStm8G86cxBUANpv2kpEsB4GMEG6NfLVRZGzZCRLQrr8deFcfZ", extkey.ToString().c_str());
  EXPECT_EQ(0, extkey.GetDepth());
  EXPECT_STREQ("59f40c9ff35a534bf02817c4c9b2a0eff6acc9b2e1e0c822dbbead73e4f69747", extkey.GetPrivkey().GetHex().c_str());
}